

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backtrack.cc
# Opt level: O2

bool __thiscall
re2::Backtracker::Search
          (Backtracker *this,StringPiece *text,StringPiece *context,bool anchored,bool longest,
          StringPiece *submatch,int nsubmatch)

{
  Prog *pPVar1;
  bool bVar2;
  bool bVar3;
  StringPiece *pSVar4;
  uint32 *__s;
  int iVar5;
  ulong uVar6;
  char *p;
  size_t sVar7;
  size_t __n;
  char *pcVar8;
  StringPiece sp0;
  
  pSVar4 = &sp0;
  (this->text_).length_ = text->length_;
  (this->text_).ptr_ = text->ptr_;
  pcVar8 = context->ptr_;
  (this->context_).ptr_ = pcVar8;
  (this->context_).length_ = context->length_;
  if (pcVar8 == (char *)0x0) {
    (this->context_).length_ = text->length_;
    (this->context_).ptr_ = text->ptr_;
  }
  bVar2 = this->prog_->anchor_start_;
  if (((bVar2 == true) && ((this->context_).ptr_ < text->ptr_)) ||
     ((bVar3 = this->prog_->anchor_end_, bVar3 == true &&
      (text->ptr_ + text->length_ < (this->context_).ptr_ + (this->context_).length_)))) {
    bVar2 = false;
  }
  else {
    this->anchored_ = (bool)(bVar2 | anchored);
    this->longest_ = (bool)(longest | bVar3);
    this->endmatch_ = bVar3;
    this->submatch_ = submatch;
    this->nsubmatch_ = nsubmatch;
    if (0x1f < nsubmatch) {
      LogMessageFatal::LogMessageFatal
                ((LogMessageFatal *)&sp0,
                 "/workspace/llm4binary/github/license_c_cmakelists/firasdib[P]re2/re2/testing/backtrack.cc"
                 ,0x72);
      std::operator<<((ostream *)&sp0.length_,"Check failed: 2*nsubmatch_ < arraysize(cap_)");
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&sp0);
    }
    memset(this->cap_,0,0x200);
    sp0.ptr_ = (char *)0x0;
    sp0.length_ = 0;
    if (nsubmatch < 1) {
      this->submatch_ = &sp0;
      this->nsubmatch_ = 1;
    }
    else {
      pSVar4 = this->submatch_;
    }
    pSVar4->ptr_ = (char *)0x0;
    pSVar4->length_ = 0;
    if (this->visited_ != (uint32 *)0x0) {
      operator_delete__(this->visited_);
    }
    pPVar1 = this->prog_;
    iVar5 = (text->length_ + 1) * pPVar1->size_;
    sVar7 = (size_t)((iVar5 + 0x1f) / 0x20);
    this->nvisited_ = sVar7;
    __n = sVar7 << 2;
    uVar6 = 0xffffffffffffffff;
    if (-0x3f < iVar5) {
      uVar6 = __n;
    }
    __s = (uint32 *)operator_new__(uVar6);
    this->visited_ = __s;
    memset(__s,0,__n);
    pcVar8 = text->ptr_;
    if (this->anchored_ == false) {
      do {
        bVar2 = pcVar8 <= text->ptr_ + text->length_;
        if (text->ptr_ + text->length_ < pcVar8) {
          return bVar2;
        }
        this->cap_[0] = pcVar8;
        bVar3 = Visit(this,this->prog_->start_,pcVar8);
        pcVar8 = pcVar8 + 1;
      } while (!bVar3);
    }
    else {
      this->cap_[0] = pcVar8;
      bVar2 = Visit(this,pPVar1->start_,pcVar8);
    }
  }
  return bVar2;
}

Assistant:

bool Backtracker::Search(const StringPiece& text, const StringPiece& context,
                         bool anchored, bool longest,
                         StringPiece* submatch, int nsubmatch) {
  text_ = text;
  context_ = context;
  if (context_.begin() == NULL)
    context_ = text;
  if (prog_->anchor_start() && text.begin() > context_.begin())
    return false;
  if (prog_->anchor_end() && text.end() < context_.end())
    return false;
  anchored_ = anchored | prog_->anchor_start();
  longest_ = longest | prog_->anchor_end();
  endmatch_ = prog_->anchor_end();
  submatch_ = submatch;
  nsubmatch_ = nsubmatch;
  CHECK(2*nsubmatch_ < arraysize(cap_));
  memset(cap_, 0, sizeof cap_);

  // We use submatch_[0] for our own bookkeeping,
  // so it had better exist.
  StringPiece sp0;
  if (nsubmatch < 1) {
    submatch_ = &sp0;
    nsubmatch_ = 1;
  }
  submatch_[0] = NULL;

  // Allocate new visited_ bitmap -- size is proportional
  // to text, so have to reallocate on each call to Search.
  delete[] visited_;
  nvisited_ = (prog_->size()*(text.size()+1) + 31)/32;
  visited_ = new uint32[nvisited_];
  memset(visited_, 0, nvisited_*sizeof visited_[0]);

  // Anchored search must start at text.begin().
  if (anchored_) {
    cap_[0] = text.begin();
    return Visit(prog_->start(), text.begin());
  }

  // Unanchored search, starting from each possible text position.
  // Notice that we have to try the empty string at the end of
  // the text, so the loop condition is p <= text.end(), not p < text.end().
  for (const char* p = text.begin(); p <= text.end(); p++) {
    cap_[0] = p;
    if (Visit(prog_->start(), p))  // Match must be leftmost; done.
      return true;
  }
  return false;
}